

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufchain.c
# Opt level: O3

void bufchain_clear(bufchain *ch)

{
  bufchain_granule *b;
  
  b = ch->head;
  while (b != (bufchain_granule *)0x0) {
    ch->head = b->next;
    smemclr(b,0x20);
    safefree(b);
    b = ch->head;
  }
  ch->tail = (bufchain_granule *)0x0;
  ch->buffersize = 0;
  return;
}

Assistant:

void bufchain_clear(bufchain *ch)
{
    struct bufchain_granule *b;
    while (ch->head) {
        b = ch->head;
        ch->head = ch->head->next;
        smemclr(b, sizeof(*b));
        sfree(b);
    }
    ch->tail = NULL;
    ch->buffersize = 0;
}